

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningHeuristics.cpp
# Opt level: O0

void __thiscall InliningThreshold::SetHeuristics(InliningThreshold *this)

{
  int local_1c;
  InliningThreshold *this_local;
  
  this->inlineThreshold = DAT_01ea9f54;
  if (this->nonLoadByteCodeCount < 0x321) {
    if (this->nonLoadByteCodeCount < 0xc9) {
      if (this->nonLoadByteCodeCount < 0x32) {
        this->inlineThreshold = DAT_01ea9f68 + this->inlineThreshold;
      }
    }
    else {
      this->inlineThreshold = this->inlineThreshold - DAT_01ea9f64;
    }
  }
  else {
    this->inlineThreshold = this->inlineThreshold - DAT_01ea9f60;
  }
  if ((this->asmjs & 1U) != 0) {
    this->inlineThreshold = DAT_01ea9f6c + this->inlineThreshold;
  }
  this->constructorInlineThreshold = DAT_01e9e31c;
  this->outsideLoopInlineThreshold = DAT_01eace54;
  this->leafInlineThreshold = DAT_01eace2c;
  this->loopInlineThreshold = DAT_01eace28;
  this->polymorphicInlineThreshold = DAT_01eafd00;
  this->maxNumberOfInlineesWithLoop = DAT_01eace5c;
  this->constantArgumentInlineThreshold = DAT_01eace30;
  if ((this->forLoopBody & 1U) == 0) {
    local_1c = DAT_01ea9f40;
  }
  else {
    local_1c = DAT_01ea9f44;
  }
  this->inlineCountMax = local_1c;
  return;
}

Assistant:

void InliningThreshold::SetHeuristics()
{
    inlineThreshold = CONFIG_FLAG(InlineThreshold);
    // Inline less aggressively in large functions since the register pressure is likely high.
    // Small functions shouldn't be a problem.
    if (nonLoadByteCodeCount > 800)
    {
        inlineThreshold -= CONFIG_FLAG(InlineThresholdAdjustCountInLargeFunction);
    }
    else if (nonLoadByteCodeCount > 200)
    {
        inlineThreshold -= CONFIG_FLAG(InlineThresholdAdjustCountInMediumSizedFunction);
    }
    else if (nonLoadByteCodeCount < 50)
    {
        inlineThreshold += CONFIG_FLAG(InlineThresholdAdjustCountInSmallFunction);
    }
    if (this->asmjs)
    {
        inlineThreshold += CONFIG_FLAG(AsmJsInlineAdjust);
    }

    constructorInlineThreshold = CONFIG_FLAG(ConstructorInlineThreshold);
    outsideLoopInlineThreshold = CONFIG_FLAG(OutsideLoopInlineThreshold);
    leafInlineThreshold = CONFIG_FLAG(LeafInlineThreshold);
    loopInlineThreshold = CONFIG_FLAG(LoopInlineThreshold);
    polymorphicInlineThreshold = CONFIG_FLAG(PolymorphicInlineThreshold);
    maxNumberOfInlineesWithLoop = CONFIG_FLAG(MaxNumberOfInlineesWithLoop);
    constantArgumentInlineThreshold = CONFIG_FLAG(ConstantArgumentInlineThreshold);
    inlineCountMax = !forLoopBody ? CONFIG_FLAG(InlineCountMax) : CONFIG_FLAG(InlineCountMaxInLoopBodies);
}